

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBidec.c
# Opt level: O0

void Abc_NtkBidecResyn(Abc_Ntk_t *pNtk,int fVerbose)

{
  Hop_Man_t *pHop;
  int iVar1;
  int iVar2;
  abctime aVar3;
  Vec_Int_t *vTruth_00;
  Bdc_Man_t *p_00;
  Abc_Obj_t *pObj_00;
  Hop_Obj_t *pHVar4;
  abctime aVar5;
  abctime clk;
  int nNodes2;
  int nNodes1;
  int nGainTotal;
  int i;
  Vec_Int_t *vTruth;
  Abc_Obj_t *pObj;
  Bdc_Man_t *p;
  Bdc_Par_t *pPars;
  Bdc_Par_t Pars;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  Pars.fVerbose = fVerbose;
  unique0x10000272 = pNtk;
  memset(&pPars,0,0xc);
  nNodes2 = 0;
  aVar3 = Abc_Clock();
  iVar1 = Abc_NtkIsLogic(stack0xfffffffffffffff0);
  if (iVar1 != 0) {
    iVar1 = Abc_NtkToAig(stack0xfffffffffffffff0);
    if (iVar1 != 0) {
      pPars._0_4_ = Abc_NtkGetFaninMax(stack0xfffffffffffffff0);
      pPars._4_4_ = Pars.fVerbose;
      if (0xf < (int)pPars) {
        if (Pars.fVerbose != 0) {
          printf("Resynthesis is not performed for nodes with more than 15 inputs.\n");
        }
        pPars._0_4_ = 0xf;
      }
      vTruth_00 = Vec_IntAlloc(0);
      p_00 = Bdc_ManAlloc((Bdc_Par_t *)&pPars);
      for (nNodes1 = 0; iVar1 = Vec_PtrSize(stack0xfffffffffffffff0->vObjs), nNodes1 < iVar1;
          nNodes1 = nNodes1 + 1) {
        pObj_00 = Abc_NtkObj(stack0xfffffffffffffff0,nNodes1);
        if (((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) &&
           (iVar1 = Abc_ObjFaninNum(pObj_00), iVar1 < 0x10)) {
          iVar1 = Hop_DagSize((Hop_Obj_t *)(pObj_00->field_5).pData);
          pHop = (Hop_Man_t *)stack0xfffffffffffffff0->pManFunc;
          pHVar4 = (Hop_Obj_t *)(pObj_00->field_5).pData;
          iVar2 = Abc_ObjFaninNum(pObj_00);
          pHVar4 = Abc_NodeIfNodeResyn(p_00,pHop,pHVar4,iVar2,vTruth_00,(uint *)0x0,-1.0);
          (pObj_00->field_5).pData = pHVar4;
          iVar2 = Hop_DagSize((Hop_Obj_t *)(pObj_00->field_5).pData);
          nNodes2 = (iVar1 - iVar2) + nNodes2;
        }
      }
      Bdc_ManFree(p_00);
      Vec_IntFree(vTruth_00);
      if (Pars.fVerbose != 0) {
        printf("Total gain in AIG nodes = %d.  ",(ulong)(uint)nNodes2);
        Abc_Print(1,"%s =","Total runtime");
        aVar5 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar3) * 1.0) / 1000000.0);
      }
    }
    return;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBidec.c"
                ,0x76,"void Abc_NtkBidecResyn(Abc_Ntk_t *, int)");
}

Assistant:

void Abc_NtkBidecResyn( Abc_Ntk_t * pNtk, int fVerbose )
{
    Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Bdc_Man_t * p;
    Abc_Obj_t * pObj;
    Vec_Int_t * vTruth;
    int i, nGainTotal = 0, nNodes1, nNodes2;
    abctime clk = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtk) );
    if ( !Abc_NtkToAig(pNtk) )
        return;
    pPars->nVarsMax = Abc_NtkGetFaninMax( pNtk );
    pPars->fVerbose = fVerbose;
    if ( pPars->nVarsMax > 15 )
    {
        if ( fVerbose )
        printf( "Resynthesis is not performed for nodes with more than 15 inputs.\n" );
        pPars->nVarsMax = 15;
    }
    vTruth = Vec_IntAlloc( 0 );
    p = Bdc_ManAlloc( pPars );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) > 15 )
            continue;
        nNodes1 = Hop_DagSize((Hop_Obj_t *)pObj->pData);
        pObj->pData = Abc_NodeIfNodeResyn( p, (Hop_Man_t *)pNtk->pManFunc, (Hop_Obj_t *)pObj->pData, Abc_ObjFaninNum(pObj), vTruth, NULL, -1.0 );
        nNodes2 = Hop_DagSize((Hop_Obj_t *)pObj->pData);
        nGainTotal += nNodes1 - nNodes2;
    }
    Bdc_ManFree( p );
    Vec_IntFree( vTruth );
    if ( fVerbose )
    {
    printf( "Total gain in AIG nodes = %d.  ", nGainTotal );
    ABC_PRT( "Total runtime", Abc_Clock() - clk );
    }
}